

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O3

void __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::ModuleImpl
          (ModuleImpl *this,Impl *loader,Own<const_kj::ReadableFile> *file,
          ReadableDirectory *sourceDir,Path *pathParam)

{
  ReadableFile *pRVar1;
  Fault f;
  Fault local_30;
  PathPtr local_28;
  
  (this->super_Module).super_ErrorReporter._vptr_ErrorReporter =
       (_func_int **)&PTR_addError_002bb200;
  this->loader = loader;
  pRVar1 = file->ptr;
  (this->file).disposer = file->disposer;
  (this->file).ptr = pRVar1;
  file->ptr = (ReadableFile *)0x0;
  this->sourceDir = sourceDir;
  (this->path).parts.ptr = (pathParam->parts).ptr;
  (this->path).parts.size_ = (pathParam->parts).size_;
  (this->path).parts.disposer = (pathParam->parts).disposer;
  (pathParam->parts).ptr = (String *)0x0;
  (pathParam->parts).size_ = 0;
  local_28.parts.ptr = (this->path).parts.ptr;
  local_28.parts.size_ = (this->path).parts.size_;
  kj::PathPtr::toString(&this->sourceNameStr,&local_28,false);
  (this->lineBreaks).ptr.disposer = (Disposer *)0x0;
  (this->lineBreaks).ptr.ptr = (LineBreakTable *)0x0;
  if ((this->path).parts.size_ != 0) {
    return;
  }
  local_30.exception = (Exception *)0x0;
  local_28.parts.ptr = (String *)0x0;
  local_28.parts.size_ = 0;
  kj::_::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/module-loader.c++"
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

ModuleImpl(ModuleLoader::Impl& loader, kj::Own<const kj::ReadableFile> file,
             const kj::ReadableDirectory& sourceDir, kj::Path pathParam)
      : loader(loader), file(kj::mv(file)), sourceDir(sourceDir), path(kj::mv(pathParam)),
        sourceNameStr(path.toString()) {
    KJ_REQUIRE(path.size() > 0);
  }